

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printDo(JSPrinter *this,Ref node)

{
  Ref *pRVar1;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  emit(this,"do");
  safeSpace(this);
  pRVar1 = Ref::operator[]((Ref *)&this_local,2);
  print(this,pRVar1->inst,"{}");
  space(this);
  emit(this,"while");
  space(this);
  emit(this,'(');
  pRVar1 = Ref::operator[]((Ref *)&this_local,1);
  print(this,pRVar1->inst);
  emit(this,')');
  return;
}

Assistant:

void printDo(Ref node) {
    emit("do");
    safeSpace();
    print(node[2], "{}");
    space();
    emit("while");
    space();
    emit('(');
    print(node[1]);
    emit(')');
  }